

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O0

void __thiscall rtosc::UndoHistoryImpl::replay(UndoHistoryImpl *this,char *msg)

{
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  rtosc_arg_t rVar2;
  rtosc_arg_t *in_stack_00000018;
  char *in_stack_00000020;
  int len;
  rtosc_arg_t arg;
  function<void_(const_char_*)> *this_00;
  undefined1 in_stack_ffffffffffffffc8 [16];
  undefined1 auVar3 [12];
  
  auVar3 = in_stack_ffffffffffffffc8._4_12_;
  rtosc_argument(in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._4_4_);
  rVar2 = rtosc_argument(auVar3._4_8_,auVar3._0_4_);
  this_00 = (function<void_(const_char_*)> *)rVar2.s;
  rtosc_argument_string(in_RSI);
  sVar1 = rtosc_amessage(msg,(size_t)arg.b.data,arg.s,in_stack_00000020,in_stack_00000018);
  if ((int)sVar1 != 0) {
    std::function<void_(const_char_*)>::operator()(this_00,in_RDI);
  }
  return;
}

Assistant:

void UndoHistoryImpl::replay(const char *msg)
{
    rtosc_arg_t arg = rtosc_argument(msg,2);
    int len = rtosc_amessage(tmp, 256, rtosc_argument(msg,0).s,
            rtosc_argument_string(msg)+2,
            &arg);
    
    if(len)
        cb(tmp);
}